

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rnndec.c
# Opt level: O1

int rnndec_varmatch(rnndeccontext *ctx,rnnvarinfo *vi)

{
  uint uVar1;
  ulong uVar2;
  int iVar3;
  long lVar4;
  
  if (vi->dead == 0) {
    iVar3 = 1;
    if (0 < vi->varsetsnum) {
      lVar4 = 0;
      do {
        uVar1 = ctx->varsnum;
        uVar2 = 0;
        if (0 < (int)uVar1) {
          uVar2 = 0;
          do {
            if (vi->varsets[lVar4]->venum == ctx->vars[uVar2]->en) goto LAB_00107321;
            uVar2 = uVar2 + 1;
          } while (uVar1 != uVar2);
          uVar2 = (ulong)uVar1;
        }
LAB_00107321:
        if ((uint)uVar2 == uVar1) {
          rnndec_varmatch_cold_1();
        }
        else if (vi->varsets[lVar4]->variants[ctx->vars[uVar2 & 0xffffffff]->variant] == 0)
        goto LAB_001072ca;
        lVar4 = lVar4 + 1;
      } while (lVar4 < vi->varsetsnum);
    }
  }
  else {
LAB_001072ca:
    iVar3 = 0;
  }
  return iVar3;
}

Assistant:

int rnndec_varmatch(struct rnndeccontext *ctx, struct rnnvarinfo *vi) {
	if (vi->dead)
		return 0;
	int i;
	for (i = 0; i < vi->varsetsnum; i++) {
		int j;
		for (j = 0; j < ctx->varsnum; j++)
			if (vi->varsets[i]->venum == ctx->vars[j]->en)
				break;
		if (j == ctx->varsnum) {
			fprintf (stderr, "I don't know which %s variant to use!\n", vi->varsets[i]->venum->name);
		} else {
			if (!vi->varsets[i]->variants[ctx->vars[j]->variant])
				return 0;
		}
	}
	return 1;
}